

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser.cc
# Opt level: O1

bool __thiscall ManifestParser::ParseEdge(ManifestParser *this,string *err)

{
  Lexer *this_00;
  pointer *pppEVar1;
  BindingEnv *pBVar2;
  Node **ppNVar3;
  pointer ppNVar4;
  StringPiece path;
  StringPiece path_00;
  StringPiece path_01;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  Rule *pRVar9;
  Edge *pEVar10;
  Pool *pPVar11;
  long *plVar12;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> _Var13;
  pointer ppNVar14;
  Node *pNVar15;
  _Rb_tree_header *p_Var16;
  ulong uVar17;
  size_type *psVar18;
  pointer ppVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  int iVar22;
  undefined8 uVar23;
  _Alloc_hider _Var24;
  ManifestParser *pMVar25;
  EvalString *this_01;
  int iVar26;
  int iVar27;
  byte bVar28;
  string dyndep;
  string pool_name;
  EvalString val;
  string rule_name;
  uint64_t slash_bits_1;
  vector<EvalString,_std::allocator<EvalString>_> outs;
  vector<EvalString,_std::allocator<EvalString>_> ins;
  uint64_t slash_bits_2;
  uint64_t slash_bits;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  byte local_151;
  ManifestParser *local_150;
  undefined1 local_148 [40];
  Edge *local_120;
  undefined1 local_118 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  int local_cc;
  Rule *local_c8;
  BindingEnv *local_c0;
  string local_b8;
  vector<EvalString,_std::allocator<EvalString>_> local_98;
  vector<EvalString,_std::allocator<EvalString>_> local_78;
  int local_5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  uint64_t local_38;
  
  local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
  super__Vector_impl_data._M_start = (EvalString *)0x0;
  local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
  super__Vector_impl_data._M_finish = (EvalString *)0x0;
  local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8._M_allocated_capacity = 0;
  local_f8._M_allocated_capacity = 0;
  local_f8._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  this_00 = &(this->super_Parser).lexer_;
  bVar6 = Lexer::ReadEvalString(this_00,(EvalString *)&local_f8,true,err);
  if (!bVar6) {
LAB_0011b8bb:
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
               *)&local_f8);
LAB_0011b8c8:
    bVar6 = false;
LAB_0011b8ca:
    std::vector<EvalString,_std::allocator<EvalString>_>::~vector(&local_98);
    std::vector<EvalString,_std::allocator<EvalString>_>::~vector(&local_78);
    return bVar6;
  }
  local_150 = this;
LAB_0011b824:
  pMVar25 = local_150;
  if (local_f8._M_allocated_capacity != local_f8._8_8_) goto LAB_0011b83a;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
             *)&local_f8);
  bVar6 = Lexer::PeekToken(this_00,PIPE);
  iVar27 = 0;
  if (bVar6) {
    iVar27 = 0;
    do {
      local_f8._M_allocated_capacity = 0;
      local_f8._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_e8._M_allocated_capacity = 0;
      bVar6 = Lexer::ReadEvalString(this_00,(EvalString *)&local_f8,true,err);
      iVar26 = 1;
      if (bVar6) {
        if (local_f8._M_allocated_capacity == local_f8._8_8_) {
          iVar26 = 4;
        }
        else {
          std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                    (&local_98,(value_type *)&local_f8);
          iVar27 = iVar27 + 1;
          iVar26 = 0;
        }
      }
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                 *)&local_f8);
    } while (iVar26 == 0);
    pMVar25 = local_150;
    if (iVar26 != 4) goto LAB_0011b8c8;
  }
  if (local_98.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_98.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_f8._M_allocated_capacity = (size_type)&local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"expected path","");
    bVar6 = Lexer::Error(this_00,(string *)&local_f8,err);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_allocated_capacity == &local_e8) goto LAB_0011b8ca;
  }
  else {
    bVar6 = Parser::ExpectToken(&pMVar25->super_Parser,COLON,err);
    if (!bVar6) goto LAB_0011b8c8;
    local_f8._M_allocated_capacity = (size_type)&local_e8;
    local_f8._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_e8._M_allocated_capacity = local_e8._M_allocated_capacity & 0xffffffffffffff00;
    bVar6 = Lexer::ReadIdent(this_00,(string *)&local_f8);
    if (bVar6) {
      pRVar9 = BindingEnv::LookupRule(pMVar25->env_,(string *)&local_f8);
      if (pRVar9 == (Rule *)0x0) {
        std::operator+(&local_178,"unknown build rule \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_f8);
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_178);
        pNVar15 = (Node *)(plVar12 + 2);
        if ((Node *)*plVar12 == pNVar15) {
          local_148._16_8_ = (pNVar15->path_)._M_dataplus._M_p;
          local_148._24_8_ = plVar12[3];
          local_148._0_8_ = (Node *)(local_148 + 0x10);
        }
        else {
          local_148._16_8_ = (pNVar15->path_)._M_dataplus._M_p;
          local_148._0_8_ = (Node *)*plVar12;
        }
        local_148._8_8_ = plVar12[1];
        *plVar12 = (long)pNVar15;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        bVar6 = Lexer::Error(this_00,(string *)local_148,err);
        if ((Node *)local_148._0_8_ != (Node *)(local_148 + 0x10)) {
          operator_delete((void *)local_148._0_8_,(ulong)(local_148._16_8_ + 1));
        }
        uVar23 = local_178.field_2._M_allocated_capacity;
        _Var24._M_p = local_178._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) goto LAB_0011bdb4;
      }
      else {
        local_c8 = pRVar9;
        do {
          local_148._0_8_ = (Node *)0x0;
          local_148._8_8_ = (Node *)0x0;
          local_148._16_8_ = (pointer)0x0;
          bVar6 = Lexer::ReadEvalString(this_00,(EvalString *)local_148,true,err);
          iVar26 = 1;
          if (bVar6) {
            if (local_148._0_8_ == local_148._8_8_) {
              iVar26 = 6;
            }
            else {
              iVar26 = 0;
              std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                        (&local_78,(EvalString *)local_148);
            }
          }
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
          ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                     *)local_148);
        } while (iVar26 == 0);
        if (iVar26 == 6) {
          bVar6 = Lexer::PeekToken(this_00,PIPE);
          local_cc = 0;
          if (bVar6) {
            local_cc = 0;
            do {
              local_148._0_8_ = (Node *)0x0;
              local_148._8_8_ = (Node *)0x0;
              local_148._16_8_ = (pointer)0x0;
              bVar6 = Lexer::ReadEvalString(this_00,(EvalString *)local_148,true,err);
              iVar26 = 1;
              if (bVar6) {
                if (local_148._0_8_ == local_148._8_8_) {
                  iVar26 = 8;
                }
                else {
                  std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                            (&local_78,(EvalString *)local_148);
                  local_cc = local_cc + 1;
                  iVar26 = 0;
                }
              }
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
              ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                         *)local_148);
            } while (iVar26 == 0);
            if (iVar26 != 8) goto LAB_0011bd06;
          }
          pMVar25 = local_150;
          bVar6 = Lexer::PeekToken(this_00,PIPE2);
          iVar26 = 0;
          if (bVar6) {
            iVar26 = 0;
            do {
              local_148._0_8_ = (Node *)0x0;
              local_148._8_8_ = (Node *)0x0;
              local_148._16_8_ = (pointer)0x0;
              bVar6 = Lexer::ReadEvalString(this_00,(EvalString *)local_148,true,err);
              iVar22 = 1;
              if (bVar6) {
                if (local_148._0_8_ == local_148._8_8_) {
                  iVar22 = 10;
                }
                else {
                  std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                            (&local_78,(EvalString *)local_148);
                  iVar26 = iVar26 + 1;
                  iVar22 = 0;
                }
              }
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
              ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                         *)local_148);
            } while (iVar22 == 0);
            pMVar25 = local_150;
            if (iVar22 != 10) goto LAB_0011bd06;
          }
          bVar6 = Parser::ExpectToken(&pMVar25->super_Parser,NEWLINE,err);
          if (bVar6) {
            bVar7 = Lexer::PeekToken(this_00,INDENT);
            local_5c = iVar26;
            if (bVar7) {
              local_c0 = (BindingEnv *)operator_new(0x70);
              pBVar2 = pMVar25->env_;
              (local_c0->super_Env)._vptr_Env = (_func_int **)&PTR__BindingEnv_00133ce0;
              p_Var16 = &(local_c0->bindings_)._M_t._M_impl.super__Rb_tree_header;
              (local_c0->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              (local_c0->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)0x0;
              (local_c0->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &p_Var16->_M_header;
              (local_c0->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   &p_Var16->_M_header;
              (local_c0->bindings_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              p_Var16 = &(local_c0->rules_)._M_t._M_impl.super__Rb_tree_header;
              (local_c0->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              (local_c0->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)0x0;
              (local_c0->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &p_Var16->_M_header;
              (local_c0->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   &p_Var16->_M_header;
              (local_c0->rules_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_c0->parent_ = pBVar2;
            }
            else {
              local_c0 = pMVar25->env_;
            }
            while (pMVar25 = local_150, bVar7 != false) {
              local_148._0_8_ = local_148 + 0x10;
              local_148._8_8_ = (Node *)0x0;
              local_148._16_8_ = local_148._16_8_ & 0xffffffffffffff00;
              local_118._16_8_ = (pointer)0x0;
              local_118._0_8_ = (pointer)0x0;
              local_118._8_8_ = (pointer)0x0;
              bVar8 = ParseLet(local_150,(string *)local_148,(EvalString *)local_118,err);
              if (bVar8) {
                EvalString::Evaluate_abi_cxx11_
                          (&local_178,(EvalString *)local_118,&pMVar25->env_->super_Env);
                BindingEnv::AddBinding(local_c0,(string *)local_148,&local_178);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_178._M_dataplus._M_p != &local_178.field_2) {
                  operator_delete(local_178._M_dataplus._M_p,
                                  (ulong)(local_178.field_2._M_allocated_capacity + 1));
                }
                bVar7 = Lexer::PeekToken(this_00,INDENT);
              }
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
              ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                         *)local_118);
              if ((Node *)local_148._0_8_ != (Node *)(local_148 + 0x10)) {
                operator_delete((void *)local_148._0_8_,(ulong)(local_148._16_8_ + 1));
              }
              bVar6 = false;
              if (!bVar8) goto LAB_0011bdbc;
            }
            pEVar10 = State::AddEdge((local_150->super_Parser).state_,local_c8);
            pEVar10->env_ = local_c0;
            local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"pool","");
            Edge::GetBinding((string *)local_148,pEVar10,&local_178);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != &local_178.field_2) {
              operator_delete(local_178._M_dataplus._M_p,
                              (ulong)(local_178.field_2._M_allocated_capacity + 1));
            }
            local_120 = pEVar10;
            if ((Node *)local_148._8_8_ == (Node *)0x0) {
              bVar6 = false;
LAB_0011c032:
              std::vector<Node_*,_std::allocator<Node_*>_>::reserve
                        (&local_120->outputs_,
                         ((long)local_98.super__Vector_base<EvalString,_std::allocator<EvalString>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_98.super__Vector_base<EvalString,_std::allocator<EvalString>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x5555555555555555);
              bVar28 = (long)local_98.super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_98.super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                             _M_impl.super__Vector_impl_data._M_start == 0;
              if (!(bool)bVar28) {
                uVar17 = ((long)local_98.super__Vector_base<EvalString,_std::allocator<EvalString>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_98.super__Vector_base<EvalString,_std::allocator<EvalString>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x5555555555555555;
                pRVar9 = (Rule *)0x0;
                do {
                  local_151 = bVar28;
                  local_c8 = pRVar9;
                  EvalString::Evaluate_abi_cxx11_
                            (&local_178,
                             (EvalString *)
                             ((long)&(pRVar9->name_)._M_dataplus._M_p +
                             (long)&((local_98.
                                      super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->parsed_).
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                    ._M_impl),&local_c0->super_Env);
                  local_118._0_8_ = local_118 + 0x10;
                  local_118._8_8_ = (pointer)0x0;
                  local_118._16_8_ = local_118._16_8_ & 0xffffffffffffff00;
                  bVar7 = CanonicalizePath(&local_178,&local_38,(string *)local_118);
                  if (bVar7) {
                    path.len_ = local_178._M_string_length;
                    path.str_ = local_178._M_dataplus._M_p;
                    bVar8 = State::AddOut((local_150->super_Parser).state_,local_120,path,local_38);
                    bVar7 = true;
                    if (!bVar8) {
                      if ((local_150->options_).dupe_edge_action_ == kDupeEdgeActionError) {
                        std::operator+(&local_58,"multiple rules generate ",&local_178);
                        plVar12 = (long *)std::__cxx11::string::append((char *)&local_58);
                        psVar18 = (size_type *)(plVar12 + 2);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)*plVar12 ==
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)psVar18) {
                          local_b8.field_2._M_allocated_capacity = *psVar18;
                          local_b8.field_2._8_8_ = plVar12[3];
                          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
                        }
                        else {
                          local_b8.field_2._M_allocated_capacity = *psVar18;
                          local_b8._M_dataplus._M_p = (pointer)*plVar12;
                        }
                        local_b8._M_string_length = plVar12[1];
                        *plVar12 = (long)psVar18;
                        plVar12[1] = 0;
                        *(undefined1 *)(plVar12 + 2) = 0;
                        Lexer::Error(this_00,&local_b8,err);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                          operator_delete(local_b8._M_dataplus._M_p,
                                          local_b8.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_58._M_dataplus._M_p != &local_58.field_2) {
                          operator_delete(local_58._M_dataplus._M_p,
                                          local_58.field_2._M_allocated_capacity + 1);
                        }
                        bVar7 = false;
                        bVar6 = false;
                      }
                      else {
                        if (local_150->quiet_ == false) {
                          Warning("multiple rules generate %s. builds involving this target will not be correct; continuing anyway [-w dupbuild=warn]"
                                  ,local_178._M_dataplus._M_p);
                        }
                        iVar27 = iVar27 + -1 + (uint)((ulong)(long)iVar27 < uVar17);
                      }
                    }
                  }
                  else {
                    bVar6 = Lexer::Error(this_00,(string *)local_118,err);
                    bVar7 = false;
                  }
                  if ((pointer)local_118._0_8_ != (pointer)(local_118 + 0x10)) {
                    operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_178._M_dataplus._M_p != &local_178.field_2) {
                    operator_delete(local_178._M_dataplus._M_p,
                                    (ulong)(local_178.field_2._M_allocated_capacity + 1));
                  }
                  bVar28 = local_151;
                  if (!bVar7) break;
                  pRVar9 = (Rule *)((long)&(local_c8->name_).field_2 + 8);
                  uVar17 = uVar17 - 1;
                  bVar28 = uVar17 == 0;
                } while (!(bool)bVar28);
              }
              pEVar10 = local_120;
              if ((bVar28 & 1) != 0) {
                if ((local_120->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start ==
                    (local_120->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
                  pppEVar1 = &(((local_150->super_Parser).state_)->edges_).
                              super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                              super__Vector_impl_data._M_finish;
                  *pppEVar1 = *pppEVar1 + -1;
                  Edge::~Edge(local_120);
                  operator_delete(pEVar10,0x68);
                  bVar6 = true;
                }
                else {
                  local_120->implicit_outs_ = iVar27;
                  std::vector<Node_*,_std::allocator<Node_*>_>::reserve
                            (&local_120->inputs_,
                             ((long)local_78.
                                    super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_78.
                                    super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5555555555555555);
                  bVar7 = local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                          _M_impl.super__Vector_impl_data._M_start ==
                          local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
                  local_c8 = (Rule *)CONCAT71(local_c8._1_7_,bVar7);
                  this_01 = local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  while (!bVar7) {
                    EvalString::Evaluate_abi_cxx11_(&local_178,this_01,&local_c0->super_Env);
                    local_118._0_8_ = local_118 + 0x10;
                    local_118._8_8_ = (pointer)0x0;
                    local_118._16_8_ = local_118._16_8_ & 0xffffffffffffff00;
                    bVar7 = CanonicalizePath(&local_178,(uint64_t *)&local_b8,(string *)local_118);
                    if (bVar7) {
                      path_00.len_ = local_178._M_string_length;
                      path_00.str_ = local_178._M_dataplus._M_p;
                      State::AddIn((local_150->super_Parser).state_,local_120,path_00,
                                   (uint64_t)local_b8._M_dataplus._M_p);
                    }
                    else {
                      bVar6 = Lexer::Error(this_00,(string *)local_118,err);
                    }
                    if ((pointer)local_118._0_8_ != (pointer)(local_118 + 0x10)) {
                      operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_178._M_dataplus._M_p != &local_178.field_2) {
                      operator_delete(local_178._M_dataplus._M_p,
                                      (ulong)(local_178.field_2._M_allocated_capacity + 1));
                    }
                    if (!bVar7) break;
                    this_01 = this_01 + 1;
                    bVar7 = this_01 ==
                            local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
                    local_c8 = (Rule *)CONCAT71(local_c8._1_7_,bVar7);
                  }
                  if (((ulong)local_c8 & 1) != 0) {
                    local_120->implicit_deps_ = local_cc;
                    local_120->order_only_deps_ = local_5c;
                    if (((local_150->options_).phony_cycle_action_ == kPhonyCycleActionWarn) &&
                       (bVar7 = Edge::maybe_phonycycle_diagnostic(local_120), bVar7)) {
                      local_178._M_dataplus._M_p =
                           (pointer)*(local_120->outputs_).
                                     super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                     super__Vector_impl_data._M_start;
                      _Var13 = std::
                               __remove_if<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>,__gnu_cxx::__ops::_Iter_equals_val<Node*const>>
                                         ((__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                           )(local_120->inputs_).
                                            super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                            _M_impl.super__Vector_impl_data._M_start,
                                          (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                           )(local_120->inputs_).
                                            super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                            _M_impl.super__Vector_impl_data._M_finish,
                                          (_Iter_equals_val<Node_*const>)&local_178);
                      ppNVar3 = (local_120->inputs_).
                                super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                super__Vector_impl_data._M_finish;
                      if (_Var13._M_current != ppNVar3) {
                        ppNVar4 = (local_120->inputs_).
                                  super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                  super__Vector_impl_data._M_finish;
                        ppNVar14 = (pointer)((long)_Var13._M_current +
                                            ((long)ppNVar4 - (long)ppNVar3));
                        if (ppNVar4 != ppNVar14) {
                          (local_120->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish = ppNVar14;
                        }
                        if (local_150->quiet_ == false) {
                          Warning("phony target \'%s\' names itself as an input; ignoring [-w phonycycle=warn]"
                                  ,*(size_type *)local_178._M_dataplus._M_p);
                        }
                      }
                    }
                    Edge::GetUnescapedDyndep_abi_cxx11_(&local_178,local_120);
                    if (local_178._M_string_length == 0) {
LAB_0011c5b4:
                      bVar6 = true;
                    }
                    else {
                      bVar7 = CanonicalizePath(&local_178,(uint64_t *)&local_58,err);
                      if (bVar7) {
                        path_01.len_ = local_178._M_string_length;
                        path_01.str_ = local_178._M_dataplus._M_p;
                        pNVar15 = State::GetNode((local_150->super_Parser).state_,path_01,
                                                 (uint64_t)local_58._M_dataplus._M_p);
                        local_120->dyndep_ = pNVar15;
                        pNVar15->dyndep_pending_ = true;
                        _Var13 = std::
                                 __find_if<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>,__gnu_cxx::__ops::_Iter_equals_val<Node*const>>
                                           ((local_120->inputs_).
                                            super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                            _M_impl.super__Vector_impl_data._M_start,
                                            (local_120->inputs_).
                                            super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                            _M_impl.super__Vector_impl_data._M_finish,
                                            &local_120->dyndep_);
                        bVar7 = _Var13._M_current !=
                                (local_120->inputs_).
                                super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                super__Vector_impl_data._M_finish;
                        if (!bVar7) {
                          std::operator+(&local_b8,"dyndep \'",&local_178);
                          plVar12 = (long *)std::__cxx11::string::append((char *)&local_b8);
                          ppVar19 = (pointer)(plVar12 + 2);
                          if ((pointer)*plVar12 == ppVar19) {
                            local_118._16_8_ = (ppVar19->first)._M_dataplus._M_p;
                            local_118._24_8_ = plVar12[3];
                            local_118._0_8_ = (pointer)(local_118 + 0x10);
                          }
                          else {
                            local_118._16_8_ = (ppVar19->first)._M_dataplus._M_p;
                            local_118._0_8_ = (pointer)*plVar12;
                          }
                          local_118._8_8_ = plVar12[1];
                          *plVar12 = (long)ppVar19;
                          plVar12[1] = 0;
                          *(undefined1 *)(plVar12 + 2) = 0;
                          bVar6 = Lexer::Error(this_00,(string *)local_118,err);
                          if ((pointer)local_118._0_8_ != (pointer)(local_118 + 0x10)) {
                            operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                            operator_delete(local_b8._M_dataplus._M_p,
                                            local_b8.field_2._M_allocated_capacity + 1);
                          }
                        }
                      }
                      else {
                        bVar7 = false;
                        bVar6 = false;
                      }
                      if (bVar7) goto LAB_0011c5b4;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_178._M_dataplus._M_p != &local_178.field_2) {
                      operator_delete(local_178._M_dataplus._M_p,
                                      (ulong)(local_178.field_2._M_allocated_capacity + 1));
                    }
                  }
                }
              }
            }
            else {
              pPVar11 = State::LookupPool((pMVar25->super_Parser).state_,(string *)local_148);
              if (pPVar11 == (Pool *)0x0) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_118,"unknown pool name \'",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_148);
                plVar12 = (long *)std::__cxx11::string::append(local_118);
                local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
                pNVar15 = (Node *)(plVar12 + 2);
                if ((Node *)*plVar12 == pNVar15) {
                  local_178.field_2._M_allocated_capacity =
                       (size_type)(pNVar15->path_)._M_dataplus._M_p;
                  local_178.field_2._8_8_ = plVar12[3];
                }
                else {
                  local_178.field_2._M_allocated_capacity =
                       (size_type)(pNVar15->path_)._M_dataplus._M_p;
                  local_178._M_dataplus._M_p = (pointer)*plVar12;
                }
                local_178._M_string_length = plVar12[1];
                *plVar12 = (long)pNVar15;
                plVar12[1] = 0;
                *(undefined1 *)(plVar12 + 2) = 0;
                bVar6 = Lexer::Error(this_00,&local_178,err);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_178._M_dataplus._M_p != &local_178.field_2) {
                  operator_delete(local_178._M_dataplus._M_p,
                                  (ulong)(local_178.field_2._M_allocated_capacity + 1));
                }
                if ((pointer)local_118._0_8_ != (pointer)(local_118 + 0x10)) {
                  operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
                }
              }
              else {
                pEVar10->pool_ = pPVar11;
                bVar6 = false;
              }
              if (pPVar11 != (Pool *)0x0) goto LAB_0011c032;
            }
            uVar23 = local_148._16_8_;
            _Var24._M_p = (pointer)local_148._0_8_;
            if ((Node *)local_148._0_8_ != (Node *)(local_148 + 0x10)) goto LAB_0011bdb4;
            goto LAB_0011bdbc;
          }
        }
LAB_0011bd06:
        bVar6 = false;
      }
    }
    else {
      local_148._0_8_ = (Node *)(local_148 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"expected build command name","");
      bVar6 = Lexer::Error(this_00,(string *)local_148,err);
      uVar23 = local_148._16_8_;
      _Var24._M_p = (pointer)local_148._0_8_;
      if ((Node *)local_148._0_8_ == (Node *)(local_148 + 0x10)) goto LAB_0011bdbc;
LAB_0011bdb4:
      operator_delete(_Var24._M_p,(ulong)((long)&(((pointer)uVar23)->first)._M_dataplus._M_p + 1));
    }
LAB_0011bdbc:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_allocated_capacity == &local_e8) goto LAB_0011b8ca;
  }
  operator_delete((void *)local_f8._M_allocated_capacity,local_e8._M_allocated_capacity + 1);
  goto LAB_0011b8ca;
LAB_0011b83a:
  std::vector<EvalString,_std::allocator<EvalString>_>::push_back(&local_98,(value_type *)&local_f8)
  ;
  uVar5 = local_f8._8_8_;
  uVar23 = local_f8._M_allocated_capacity;
  if (local_f8._8_8_ != local_f8._M_allocated_capacity) {
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_f8._M_allocated_capacity + 0x10);
    do {
      plVar12 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (paVar20 + -1))->_M_dataplus)._M_p;
      if (paVar20 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar12) {
        operator_delete(plVar12,paVar20->_M_allocated_capacity + 1);
      }
      paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar20 + 0x18);
      paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar20 + 0x28);
    } while (paVar21 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)uVar5);
    local_f8._8_8_ = uVar23;
  }
  bVar6 = Lexer::ReadEvalString(this_00,(EvalString *)&local_f8,true,err);
  if (!bVar6) goto LAB_0011b8bb;
  goto LAB_0011b824;
}

Assistant:

bool ManifestParser::ParseEdge(string* err) {
  vector<EvalString> ins, outs;

  {
    EvalString out;
    if (!lexer_.ReadPath(&out, err))
      return false;
    while (!out.empty()) {
      outs.push_back(out);

      out.Clear();
      if (!lexer_.ReadPath(&out, err))
        return false;
    }
  }

  // Add all implicit outs, counting how many as we go.
  int implicit_outs = 0;
  if (lexer_.PeekToken(Lexer::PIPE)) {
    for (;;) {
      EvalString out;
      if (!lexer_.ReadPath(&out, err))
        return false;
      if (out.empty())
        break;
      outs.push_back(out);
      ++implicit_outs;
    }
  }

  if (outs.empty())
    return lexer_.Error("expected path", err);

  if (!ExpectToken(Lexer::COLON, err))
    return false;

  string rule_name;
  if (!lexer_.ReadIdent(&rule_name))
    return lexer_.Error("expected build command name", err);

  const Rule* rule = env_->LookupRule(rule_name);
  if (!rule)
    return lexer_.Error("unknown build rule '" + rule_name + "'", err);

  for (;;) {
    // XXX should we require one path here?
    EvalString in;
    if (!lexer_.ReadPath(&in, err))
      return false;
    if (in.empty())
      break;
    ins.push_back(in);
  }

  // Add all implicit deps, counting how many as we go.
  int implicit = 0;
  if (lexer_.PeekToken(Lexer::PIPE)) {
    for (;;) {
      EvalString in;
      if (!lexer_.ReadPath(&in, err))
        return false;
      if (in.empty())
        break;
      ins.push_back(in);
      ++implicit;
    }
  }

  // Add all order-only deps, counting how many as we go.
  int order_only = 0;
  if (lexer_.PeekToken(Lexer::PIPE2)) {
    for (;;) {
      EvalString in;
      if (!lexer_.ReadPath(&in, err))
        return false;
      if (in.empty())
        break;
      ins.push_back(in);
      ++order_only;
    }
  }

  if (!ExpectToken(Lexer::NEWLINE, err))
    return false;

  // Bindings on edges are rare, so allocate per-edge envs only when needed.
  bool has_indent_token = lexer_.PeekToken(Lexer::INDENT);
  BindingEnv* env = has_indent_token ? new BindingEnv(env_) : env_;
  while (has_indent_token) {
    string key;
    EvalString val;
    if (!ParseLet(&key, &val, err))
      return false;

    env->AddBinding(key, val.Evaluate(env_));
    has_indent_token = lexer_.PeekToken(Lexer::INDENT);
  }

  Edge* edge = state_->AddEdge(rule);
  edge->env_ = env;

  string pool_name = edge->GetBinding("pool");
  if (!pool_name.empty()) {
    Pool* pool = state_->LookupPool(pool_name);
    if (pool == NULL)
      return lexer_.Error("unknown pool name '" + pool_name + "'", err);
    edge->pool_ = pool;
  }

  edge->outputs_.reserve(outs.size());
  for (size_t i = 0, e = outs.size(); i != e; ++i) {
    string path = outs[i].Evaluate(env);
    string path_err;
    uint64_t slash_bits;
    if (!CanonicalizePath(&path, &slash_bits, &path_err))
      return lexer_.Error(path_err, err);
    if (!state_->AddOut(edge, path, slash_bits)) {
      if (options_.dupe_edge_action_ == kDupeEdgeActionError) {
        lexer_.Error("multiple rules generate " + path + " [-w dupbuild=err]",
                     err);
        return false;
      } else {
        if (!quiet_) {
          Warning("multiple rules generate %s. "
                  "builds involving this target will not be correct; "
                  "continuing anyway [-w dupbuild=warn]",
                  path.c_str());
        }
        if (e - i <= static_cast<size_t>(implicit_outs))
          --implicit_outs;
      }
    }
  }
  if (edge->outputs_.empty()) {
    // All outputs of the edge are already created by other edges. Don't add
    // this edge.  Do this check before input nodes are connected to the edge.
    state_->edges_.pop_back();
    delete edge;
    return true;
  }
  edge->implicit_outs_ = implicit_outs;

  edge->inputs_.reserve(ins.size());
  for (vector<EvalString>::iterator i = ins.begin(); i != ins.end(); ++i) {
    string path = i->Evaluate(env);
    string path_err;
    uint64_t slash_bits;
    if (!CanonicalizePath(&path, &slash_bits, &path_err))
      return lexer_.Error(path_err, err);
    state_->AddIn(edge, path, slash_bits);
  }
  edge->implicit_deps_ = implicit;
  edge->order_only_deps_ = order_only;

  if (options_.phony_cycle_action_ == kPhonyCycleActionWarn &&
      edge->maybe_phonycycle_diagnostic()) {
    // CMake 2.8.12.x and 3.0.x incorrectly write phony build statements
    // that reference themselves.  Ninja used to tolerate these in the
    // build graph but that has since been fixed.  Filter them out to
    // support users of those old CMake versions.
    Node* out = edge->outputs_[0];
    vector<Node*>::iterator new_end =
        remove(edge->inputs_.begin(), edge->inputs_.end(), out);
    if (new_end != edge->inputs_.end()) {
      edge->inputs_.erase(new_end, edge->inputs_.end());
      if (!quiet_) {
        Warning("phony target '%s' names itself as an input; "
                "ignoring [-w phonycycle=warn]",
                out->path().c_str());
      }
    }
  }

  // Lookup, validate, and save any dyndep binding.  It will be used later
  // to load generated dependency information dynamically, but it must
  // be one of our manifest-specified inputs.
  string dyndep = edge->GetUnescapedDyndep();
  if (!dyndep.empty()) {
    uint64_t slash_bits;
    if (!CanonicalizePath(&dyndep, &slash_bits, err))
      return false;
    edge->dyndep_ = state_->GetNode(dyndep, slash_bits);
    edge->dyndep_->set_dyndep_pending(true);
    vector<Node*>::iterator dgi =
      std::find(edge->inputs_.begin(), edge->inputs_.end(), edge->dyndep_);
    if (dgi == edge->inputs_.end()) {
      return lexer_.Error("dyndep '" + dyndep + "' is not an input", err);
    }
  }

  return true;
}